

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_symboltable.c
# Opt level: O0

symboltable_t * symboltable_create(symtable_tag tag)

{
  size_t sVar1;
  gravity_hash_t *pgVar2;
  ghash_r *pgVar3;
  gravity_hash_t **ppgVar4;
  code *free_fn;
  size_t local_30;
  gravity_hash_t *hash;
  symboltable_t *table;
  _Bool is_enum;
  symboltable_t *psStack_10;
  symtable_tag tag_local;
  
  psStack_10 = (symboltable_t *)gravity_calloc((gravity_vm *)0x0,1,0x18);
  free_fn = symboltable_hash_free;
  if (tag == SYMTABLE_TAG_ENUM) {
    free_fn = symboltable_keyvalue_free;
  }
  pgVar2 = gravity_hash_create(0,gravity_value_hash,gravity_value_equals,free_fn,(void *)0x0);
  if (psStack_10 == (symboltable_t *)0x0) {
    psStack_10 = (symboltable_t *)0x0;
  }
  else {
    psStack_10->tag = tag;
    psStack_10->count1 = 0;
    psStack_10->count2 = 0;
    psStack_10->count3 = 0;
    pgVar3 = (ghash_r *)gravity_calloc((gravity_vm *)0x0,1,0x18);
    psStack_10->stack = pgVar3;
    psStack_10->stack->m = 0;
    psStack_10->stack->n = 0;
    psStack_10->stack->p = (gravity_hash_t **)0x0;
    if (psStack_10->stack->n == psStack_10->stack->m) {
      if (psStack_10->stack->m == 0) {
        local_30 = 8;
      }
      else {
        local_30 = psStack_10->stack->m << 1;
      }
      psStack_10->stack->m = local_30;
      ppgVar4 = (gravity_hash_t **)realloc(psStack_10->stack->p,psStack_10->stack->m << 3);
      psStack_10->stack->p = ppgVar4;
    }
    ppgVar4 = psStack_10->stack->p;
    sVar1 = psStack_10->stack->n;
    psStack_10->stack->n = sVar1 + 1;
    ppgVar4[sVar1] = pgVar2;
  }
  return psStack_10;
}

Assistant:

symboltable_t *symboltable_create (symtable_tag tag) {
    bool is_enum = (tag == SYMTABLE_TAG_ENUM);
    
    symboltable_t    *table = mem_alloc(NULL, sizeof(symboltable_t));
    gravity_hash_t    *hash = gravity_hash_create(0, gravity_value_hash, gravity_value_equals,
                                                (is_enum) ? symboltable_keyvalue_free : symboltable_hash_free, NULL);
    if (!table) return NULL;

    // init symbol table
    table->tag = tag;
    table->count1 = 0;
    table->count2 = 0;
    table->count3 = 0;
    table->stack = mem_alloc(NULL, sizeof(ghash_r));
    scope_stack_init(table->stack);
    scope_stack_push(table->stack, hash);

    return table;
}